

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::cycle_edit_action(Application *this)

{
  if (this->action == Edit) {
    DynamicScene::XFormWidget::cycleMode(this->scene->elementTransform);
  }
  else {
    this->action = Edit;
    setupElementTransformWidget(this);
  }
  updateWidgets(this);
  return;
}

Assistant:

void Application::cycle_edit_action()
{
  if( action != Action::Edit ) {
    action = Action::Edit;
    setupElementTransformWidget();
  } else {
    scene->elementTransform->cycleMode();
  }  
  updateWidgets();
}